

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O0

void __thiscall Messages::Person::SharedDtor(Person *this)

{
  Arena *pAVar1;
  LogMessage *pLVar2;
  string *psVar3;
  LogFinisher local_5d [20];
  byte local_49;
  LogMessage local_48 [56];
  Person *local_10;
  Person *this_local;
  
  local_10 = this;
  pAVar1 = google::protobuf::MessageLite::GetArena((MessageLite *)this);
  local_49 = 0;
  if (pAVar1 != (Arena *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SamuelXing[P]protobuf-over-tcpsocket-example/build_O0/proto/messages.pb.cc"
               ,0x1f9);
    local_49 = 1;
    pLVar2 = (LogMessage *)
             google::protobuf::internal::LogMessage::operator<<
                       (local_48,"CHECK failed: GetArena() == nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(local_5d,pLVar2);
  }
  if ((local_49 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(local_48);
  }
  psVar3 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena(&this->name_,psVar3);
  psVar3 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena(&this->email_,psVar3);
  return;
}

Assistant:

void Person::SharedDtor() {
  GOOGLE_DCHECK(GetArena() == nullptr);
  name_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  email_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
}